

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O3

void ctl_arena_refresh(tsdn_t *tsdn,arena_t *arena,ctl_arena_t *ctl_sdarena,uint i,_Bool destroyed)

{
  uint64_t *puVar1;
  long *plVar2;
  atomic_zu_t *paVar3;
  long *plVar4;
  long *plVar5;
  uint uVar6;
  ctl_arena_stats_t *pcVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  ctl_arena_t *pcVar13;
  size_t sVar14;
  uint64_t uVar15;
  long lVar16;
  ctl_arena_stats_t *pcVar17;
  size_t *psVar18;
  nstime_t *pnVar19;
  nstime_t *pnVar20;
  uint64_t uVar21;
  uint64_t uVar22;
  uint64_t uVar23;
  uint64_t uVar24;
  
  pcVar13 = arenas_i((ulong)i);
  pcVar13->nthreads = 0;
  pcVar13->dss = dss_prec_names[3];
  *(undefined4 *)&pcVar13->dirty_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&pcVar13->dirty_decay_ms + 4) = 0xffffffff;
  *(undefined4 *)&pcVar13->muzzy_decay_ms = 0xffffffff;
  *(undefined4 *)((long)&pcVar13->muzzy_decay_ms + 4) = 0xffffffff;
  pcVar13->pactive = 0;
  pcVar13->pdirty = 0;
  pcVar13->pmuzzy = 0;
  memset(pcVar13->astats,0,0x27a8);
  memset(&pcVar13->astats->allocated_small,0,0x1470);
  memset(pcVar13->astats->lstats,0,0x24c0);
  memset(pcVar13->astats->estats,0,0x2550);
  pcVar7 = pcVar13->astats;
  arena_stats_merge(tsdn,arena,&pcVar13->nthreads,&pcVar13->dss,&pcVar13->dirty_decay_ms,
                    &pcVar13->muzzy_decay_ms,&pcVar13->pactive,&pcVar13->pdirty,&pcVar13->pmuzzy,
                    &pcVar7->astats,pcVar7->bstats,pcVar7->lstats,pcVar7->estats);
  pcVar7 = pcVar13->astats;
  sVar14 = pcVar7->allocated_small;
  uVar21 = pcVar7->nmalloc_small;
  uVar22 = pcVar7->ndalloc_small;
  uVar15 = pcVar7->nrequests_small;
  uVar23 = pcVar7->nfills_small;
  uVar24 = pcVar7->nflushes_small;
  lVar16 = 0x4ff;
  psVar18 = sz_index2size_tab;
  do {
    sVar14 = sVar14 + *psVar18 * *(long *)((long)pcVar7 + lVar16 * 8 + -8);
    pcVar7->allocated_small = sVar14;
    plVar2 = (long *)((long)pcVar7 + lVar16 * 8 + -0x20);
    uVar21 = uVar21 + *plVar2;
    uVar22 = uVar22 + plVar2[1];
    pcVar7->nmalloc_small = uVar21;
    pcVar7->ndalloc_small = uVar22;
    uVar15 = uVar15 + *(long *)((long)pcVar7 + lVar16 * 8 + -0x10);
    pcVar7->nrequests_small = uVar15;
    paVar3 = &(pcVar7->astats).mapped + lVar16;
    uVar23 = uVar23 + paVar3->repr;
    uVar24 = uVar24 + paVar3[1].repr;
    pcVar7->nfills_small = uVar23;
    pcVar7->nflushes_small = uVar24;
    lVar16 = lVar16 + 0x12;
    psVar18 = psVar18 + 1;
  } while (lVar16 != 0x787);
  if (destroyed) {
    pcVar17 = ctl_sdarena->astats;
  }
  else {
    ctl_sdarena->nthreads = ctl_sdarena->nthreads + pcVar13->nthreads;
    sVar14 = pcVar13->pdirty;
    ctl_sdarena->pactive = ctl_sdarena->pactive + pcVar13->pactive;
    ctl_sdarena->pdirty = ctl_sdarena->pdirty + sVar14;
    ctl_sdarena->pmuzzy = ctl_sdarena->pmuzzy + pcVar13->pmuzzy;
    pcVar17 = ctl_sdarena->astats;
    (pcVar17->astats).mapped.repr = (pcVar7->astats).mapped.repr + (pcVar17->astats).mapped.repr;
    (pcVar17->astats).retained.repr =
         (pcVar7->astats).retained.repr + (pcVar17->astats).retained.repr;
    (pcVar17->astats).extent_avail.repr =
         (pcVar7->astats).extent_avail.repr + (pcVar17->astats).extent_avail.repr;
  }
  (pcVar17->astats).decay_dirty.npurge.repr =
       (pcVar7->astats).decay_dirty.npurge.repr + (pcVar17->astats).decay_dirty.npurge.repr;
  (pcVar17->astats).decay_dirty.nmadvise.repr =
       (pcVar7->astats).decay_dirty.nmadvise.repr + (pcVar17->astats).decay_dirty.nmadvise.repr;
  (pcVar17->astats).decay_dirty.purged.repr =
       (pcVar7->astats).decay_dirty.purged.repr + (pcVar17->astats).decay_dirty.purged.repr;
  (pcVar17->astats).decay_muzzy.npurge.repr =
       (pcVar7->astats).decay_muzzy.npurge.repr + (pcVar17->astats).decay_muzzy.npurge.repr;
  (pcVar17->astats).decay_muzzy.nmadvise.repr =
       (pcVar7->astats).decay_muzzy.nmadvise.repr + (pcVar17->astats).decay_muzzy.nmadvise.repr;
  (pcVar17->astats).decay_muzzy.purged.repr =
       (pcVar7->astats).decay_muzzy.purged.repr + (pcVar17->astats).decay_muzzy.purged.repr;
  nstime_add(&(pcVar17->astats).mutex_prof_data[0].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[0].tot_wait_time);
  pnVar19 = &(pcVar17->astats).mutex_prof_data[0].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[0].max_wait_time;
  iVar12 = nstime_compare(pnVar19,pnVar20);
  if (iVar12 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar15 = (pcVar7->astats).mutex_prof_data[0].n_spin_acquired;
  uVar21 = (pcVar17->astats).mutex_prof_data[0].n_spin_acquired;
  (pcVar17->astats).mutex_prof_data[0].n_wait_times =
       (pcVar17->astats).mutex_prof_data[0].n_wait_times +
       (pcVar7->astats).mutex_prof_data[0].n_wait_times;
  (pcVar17->astats).mutex_prof_data[0].n_spin_acquired = uVar21 + uVar15;
  uVar6 = (pcVar7->astats).mutex_prof_data[0].max_n_thds;
  if ((pcVar17->astats).mutex_prof_data[0].max_n_thds < uVar6) {
    (pcVar17->astats).mutex_prof_data[0].max_n_thds = uVar6;
  }
  (pcVar17->astats).mutex_prof_data[0].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[0].n_waiting_thds.repr +
       (pcVar17->astats).mutex_prof_data[0].n_waiting_thds.repr;
  puVar1 = &(pcVar17->astats).mutex_prof_data[0].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[0].n_owner_switches;
  puVar1 = &(pcVar17->astats).mutex_prof_data[0].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[0].n_lock_ops;
  nstime_add(&(pcVar17->astats).mutex_prof_data[1].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[1].tot_wait_time);
  pnVar19 = &(pcVar17->astats).mutex_prof_data[1].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[1].max_wait_time;
  iVar12 = nstime_compare(pnVar19,pnVar20);
  if (iVar12 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar15 = (pcVar7->astats).mutex_prof_data[1].n_spin_acquired;
  uVar21 = (pcVar17->astats).mutex_prof_data[1].n_spin_acquired;
  (pcVar17->astats).mutex_prof_data[1].n_wait_times =
       (pcVar17->astats).mutex_prof_data[1].n_wait_times +
       (pcVar7->astats).mutex_prof_data[1].n_wait_times;
  (pcVar17->astats).mutex_prof_data[1].n_spin_acquired = uVar21 + uVar15;
  uVar6 = (pcVar7->astats).mutex_prof_data[1].max_n_thds;
  if ((pcVar17->astats).mutex_prof_data[1].max_n_thds < uVar6) {
    (pcVar17->astats).mutex_prof_data[1].max_n_thds = uVar6;
  }
  (pcVar17->astats).mutex_prof_data[1].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[1].n_waiting_thds.repr +
       (pcVar17->astats).mutex_prof_data[1].n_waiting_thds.repr;
  puVar1 = &(pcVar17->astats).mutex_prof_data[1].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[1].n_owner_switches;
  puVar1 = &(pcVar17->astats).mutex_prof_data[1].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[1].n_lock_ops;
  nstime_add(&(pcVar17->astats).mutex_prof_data[2].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[2].tot_wait_time);
  pnVar19 = &(pcVar17->astats).mutex_prof_data[2].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[2].max_wait_time;
  iVar12 = nstime_compare(pnVar19,pnVar20);
  if (iVar12 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar15 = (pcVar7->astats).mutex_prof_data[2].n_spin_acquired;
  uVar21 = (pcVar17->astats).mutex_prof_data[2].n_spin_acquired;
  (pcVar17->astats).mutex_prof_data[2].n_wait_times =
       (pcVar17->astats).mutex_prof_data[2].n_wait_times +
       (pcVar7->astats).mutex_prof_data[2].n_wait_times;
  (pcVar17->astats).mutex_prof_data[2].n_spin_acquired = uVar21 + uVar15;
  uVar6 = (pcVar7->astats).mutex_prof_data[2].max_n_thds;
  if ((pcVar17->astats).mutex_prof_data[2].max_n_thds < uVar6) {
    (pcVar17->astats).mutex_prof_data[2].max_n_thds = uVar6;
  }
  (pcVar17->astats).mutex_prof_data[2].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[2].n_waiting_thds.repr +
       (pcVar17->astats).mutex_prof_data[2].n_waiting_thds.repr;
  puVar1 = &(pcVar17->astats).mutex_prof_data[2].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[2].n_owner_switches;
  puVar1 = &(pcVar17->astats).mutex_prof_data[2].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[2].n_lock_ops;
  nstime_add(&(pcVar17->astats).mutex_prof_data[3].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[3].tot_wait_time);
  pnVar19 = &(pcVar17->astats).mutex_prof_data[3].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[3].max_wait_time;
  iVar12 = nstime_compare(pnVar19,pnVar20);
  if (iVar12 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar15 = (pcVar7->astats).mutex_prof_data[3].n_spin_acquired;
  uVar21 = (pcVar17->astats).mutex_prof_data[3].n_spin_acquired;
  (pcVar17->astats).mutex_prof_data[3].n_wait_times =
       (pcVar17->astats).mutex_prof_data[3].n_wait_times +
       (pcVar7->astats).mutex_prof_data[3].n_wait_times;
  (pcVar17->astats).mutex_prof_data[3].n_spin_acquired = uVar21 + uVar15;
  uVar6 = (pcVar7->astats).mutex_prof_data[3].max_n_thds;
  if ((pcVar17->astats).mutex_prof_data[3].max_n_thds < uVar6) {
    (pcVar17->astats).mutex_prof_data[3].max_n_thds = uVar6;
  }
  (pcVar17->astats).mutex_prof_data[3].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[3].n_waiting_thds.repr +
       (pcVar17->astats).mutex_prof_data[3].n_waiting_thds.repr;
  puVar1 = &(pcVar17->astats).mutex_prof_data[3].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[3].n_owner_switches;
  puVar1 = &(pcVar17->astats).mutex_prof_data[3].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[3].n_lock_ops;
  nstime_add(&(pcVar17->astats).mutex_prof_data[4].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[4].tot_wait_time);
  pnVar19 = &(pcVar17->astats).mutex_prof_data[4].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[4].max_wait_time;
  iVar12 = nstime_compare(pnVar19,pnVar20);
  if (iVar12 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar15 = (pcVar7->astats).mutex_prof_data[4].n_spin_acquired;
  uVar21 = (pcVar17->astats).mutex_prof_data[4].n_spin_acquired;
  (pcVar17->astats).mutex_prof_data[4].n_wait_times =
       (pcVar17->astats).mutex_prof_data[4].n_wait_times +
       (pcVar7->astats).mutex_prof_data[4].n_wait_times;
  (pcVar17->astats).mutex_prof_data[4].n_spin_acquired = uVar21 + uVar15;
  uVar6 = (pcVar7->astats).mutex_prof_data[4].max_n_thds;
  if ((pcVar17->astats).mutex_prof_data[4].max_n_thds < uVar6) {
    (pcVar17->astats).mutex_prof_data[4].max_n_thds = uVar6;
  }
  (pcVar17->astats).mutex_prof_data[4].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[4].n_waiting_thds.repr +
       (pcVar17->astats).mutex_prof_data[4].n_waiting_thds.repr;
  puVar1 = &(pcVar17->astats).mutex_prof_data[4].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[4].n_owner_switches;
  puVar1 = &(pcVar17->astats).mutex_prof_data[4].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[4].n_lock_ops;
  nstime_add(&(pcVar17->astats).mutex_prof_data[5].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[5].tot_wait_time);
  pnVar19 = &(pcVar17->astats).mutex_prof_data[5].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[5].max_wait_time;
  iVar12 = nstime_compare(pnVar19,pnVar20);
  if (iVar12 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar15 = (pcVar7->astats).mutex_prof_data[5].n_spin_acquired;
  uVar21 = (pcVar17->astats).mutex_prof_data[5].n_spin_acquired;
  (pcVar17->astats).mutex_prof_data[5].n_wait_times =
       (pcVar17->astats).mutex_prof_data[5].n_wait_times +
       (pcVar7->astats).mutex_prof_data[5].n_wait_times;
  (pcVar17->astats).mutex_prof_data[5].n_spin_acquired = uVar21 + uVar15;
  uVar6 = (pcVar7->astats).mutex_prof_data[5].max_n_thds;
  if ((pcVar17->astats).mutex_prof_data[5].max_n_thds < uVar6) {
    (pcVar17->astats).mutex_prof_data[5].max_n_thds = uVar6;
  }
  (pcVar17->astats).mutex_prof_data[5].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[5].n_waiting_thds.repr +
       (pcVar17->astats).mutex_prof_data[5].n_waiting_thds.repr;
  puVar1 = &(pcVar17->astats).mutex_prof_data[5].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[5].n_owner_switches;
  puVar1 = &(pcVar17->astats).mutex_prof_data[5].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[5].n_lock_ops;
  nstime_add(&(pcVar17->astats).mutex_prof_data[6].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[6].tot_wait_time);
  pnVar19 = &(pcVar17->astats).mutex_prof_data[6].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[6].max_wait_time;
  iVar12 = nstime_compare(pnVar19,pnVar20);
  if (iVar12 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar15 = (pcVar7->astats).mutex_prof_data[6].n_spin_acquired;
  uVar21 = (pcVar17->astats).mutex_prof_data[6].n_spin_acquired;
  (pcVar17->astats).mutex_prof_data[6].n_wait_times =
       (pcVar17->astats).mutex_prof_data[6].n_wait_times +
       (pcVar7->astats).mutex_prof_data[6].n_wait_times;
  (pcVar17->astats).mutex_prof_data[6].n_spin_acquired = uVar21 + uVar15;
  uVar6 = (pcVar7->astats).mutex_prof_data[6].max_n_thds;
  if ((pcVar17->astats).mutex_prof_data[6].max_n_thds < uVar6) {
    (pcVar17->astats).mutex_prof_data[6].max_n_thds = uVar6;
  }
  (pcVar17->astats).mutex_prof_data[6].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[6].n_waiting_thds.repr +
       (pcVar17->astats).mutex_prof_data[6].n_waiting_thds.repr;
  puVar1 = &(pcVar17->astats).mutex_prof_data[6].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[6].n_owner_switches;
  puVar1 = &(pcVar17->astats).mutex_prof_data[6].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[6].n_lock_ops;
  nstime_add(&(pcVar17->astats).mutex_prof_data[7].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[7].tot_wait_time);
  pnVar19 = &(pcVar17->astats).mutex_prof_data[7].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[7].max_wait_time;
  iVar12 = nstime_compare(pnVar19,pnVar20);
  if (iVar12 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar15 = (pcVar7->astats).mutex_prof_data[7].n_spin_acquired;
  uVar21 = (pcVar17->astats).mutex_prof_data[7].n_spin_acquired;
  (pcVar17->astats).mutex_prof_data[7].n_wait_times =
       (pcVar17->astats).mutex_prof_data[7].n_wait_times +
       (pcVar7->astats).mutex_prof_data[7].n_wait_times;
  (pcVar17->astats).mutex_prof_data[7].n_spin_acquired = uVar21 + uVar15;
  uVar6 = (pcVar7->astats).mutex_prof_data[7].max_n_thds;
  if ((pcVar17->astats).mutex_prof_data[7].max_n_thds < uVar6) {
    (pcVar17->astats).mutex_prof_data[7].max_n_thds = uVar6;
  }
  (pcVar17->astats).mutex_prof_data[7].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[7].n_waiting_thds.repr +
       (pcVar17->astats).mutex_prof_data[7].n_waiting_thds.repr;
  puVar1 = &(pcVar17->astats).mutex_prof_data[7].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[7].n_owner_switches;
  puVar1 = &(pcVar17->astats).mutex_prof_data[7].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[7].n_lock_ops;
  nstime_add(&(pcVar17->astats).mutex_prof_data[8].tot_wait_time,
             &(pcVar7->astats).mutex_prof_data[8].tot_wait_time);
  pnVar19 = &(pcVar17->astats).mutex_prof_data[8].max_wait_time;
  pnVar20 = &(pcVar7->astats).mutex_prof_data[8].max_wait_time;
  iVar12 = nstime_compare(pnVar19,pnVar20);
  if (iVar12 < 0) {
    nstime_copy(pnVar19,pnVar20);
  }
  uVar15 = (pcVar7->astats).mutex_prof_data[8].n_spin_acquired;
  uVar21 = (pcVar17->astats).mutex_prof_data[8].n_spin_acquired;
  (pcVar17->astats).mutex_prof_data[8].n_wait_times =
       (pcVar17->astats).mutex_prof_data[8].n_wait_times +
       (pcVar7->astats).mutex_prof_data[8].n_wait_times;
  (pcVar17->astats).mutex_prof_data[8].n_spin_acquired = uVar21 + uVar15;
  uVar6 = (pcVar7->astats).mutex_prof_data[8].max_n_thds;
  if ((pcVar17->astats).mutex_prof_data[8].max_n_thds < uVar6) {
    (pcVar17->astats).mutex_prof_data[8].max_n_thds = uVar6;
  }
  (pcVar17->astats).mutex_prof_data[8].n_waiting_thds.repr =
       (pcVar7->astats).mutex_prof_data[8].n_waiting_thds.repr +
       (pcVar17->astats).mutex_prof_data[8].n_waiting_thds.repr;
  puVar1 = &(pcVar17->astats).mutex_prof_data[8].n_owner_switches;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[8].n_owner_switches;
  puVar1 = &(pcVar17->astats).mutex_prof_data[8].n_lock_ops;
  *puVar1 = *puVar1 + (pcVar7->astats).mutex_prof_data[8].n_lock_ops;
  if (!destroyed) {
    (pcVar17->astats).base.repr = (pcVar7->astats).base.repr + (pcVar17->astats).base.repr;
    (pcVar17->astats).internal.repr =
         (pcVar7->astats).internal.repr + (pcVar17->astats).internal.repr;
    (pcVar17->astats).resident.repr =
         (pcVar7->astats).resident.repr + (pcVar17->astats).resident.repr;
    (pcVar17->astats).metadata_thp.repr =
         (pcVar7->astats).metadata_thp.repr + (pcVar17->astats).metadata_thp.repr;
    pcVar17->allocated_small = pcVar17->allocated_small + pcVar7->allocated_small;
  }
  uVar15 = pcVar7->ndalloc_small;
  pcVar17->nmalloc_small = pcVar17->nmalloc_small + pcVar7->nmalloc_small;
  pcVar17->ndalloc_small = pcVar17->ndalloc_small + uVar15;
  uVar15 = pcVar7->nfills_small;
  pcVar17->nrequests_small = pcVar7->nrequests_small + pcVar17->nrequests_small;
  pcVar17->nfills_small = uVar15 + pcVar17->nfills_small;
  pcVar17->nflushes_small = pcVar17->nflushes_small + pcVar7->nflushes_small;
  if (!destroyed) {
    (pcVar17->astats).allocated_large.repr =
         (pcVar7->astats).allocated_large.repr + (pcVar17->astats).allocated_large.repr;
  }
  (pcVar17->astats).nmalloc_large.repr =
       (pcVar7->astats).nmalloc_large.repr + (pcVar17->astats).nmalloc_large.repr;
  (pcVar17->astats).ndalloc_large.repr =
       (pcVar7->astats).ndalloc_large.repr + (pcVar17->astats).ndalloc_large.repr;
  (pcVar17->astats).nrequests_large.repr =
       (pcVar7->astats).nrequests_large.repr + (pcVar17->astats).nrequests_large.repr;
  (pcVar17->astats).tcache_bytes.repr =
       (pcVar7->astats).tcache_bytes.repr + (pcVar17->astats).tcache_bytes.repr;
  if (pcVar13->arena_ind == 0) {
    (pcVar17->astats).uptime.ns = (pcVar7->astats).uptime.ns;
  }
  lVar16 = 0;
  do {
    plVar2 = (long *)((long)&pcVar7->bstats[0].nmalloc + lVar16);
    lVar8 = plVar2[1];
    plVar4 = (long *)((long)&pcVar17->bstats[0].nmalloc + lVar16);
    lVar9 = plVar4[1];
    plVar5 = (long *)((long)&pcVar17->bstats[0].nmalloc + lVar16);
    *plVar5 = *plVar4 + *plVar2;
    plVar5[1] = lVar9 + lVar8;
    plVar2 = (long *)((long)&pcVar17->bstats[0].nrequests + lVar16);
    *plVar2 = *plVar2 + *(long *)((long)&pcVar7->bstats[0].nrequests + lVar16);
    if (!destroyed) {
      plVar2 = (long *)((long)&pcVar17->bstats[0].curregs + lVar16);
      *plVar2 = *plVar2 + *(long *)((long)&pcVar7->bstats[0].curregs + lVar16);
    }
    plVar2 = (long *)((long)&pcVar7->bstats[0].nfills + lVar16);
    lVar8 = plVar2[1];
    plVar4 = (long *)((long)&pcVar17->bstats[0].nfills + lVar16);
    lVar9 = plVar4[1];
    plVar5 = (long *)((long)&pcVar17->bstats[0].nslabs + lVar16);
    lVar10 = *plVar5;
    lVar11 = plVar5[1];
    plVar5 = (long *)((long)&pcVar17->bstats[0].nfills + lVar16);
    *plVar5 = *plVar4 + *plVar2;
    plVar5[1] = lVar9 + lVar8;
    plVar2 = (long *)((long)&pcVar7->bstats[0].nslabs + lVar16);
    lVar8 = plVar2[1];
    plVar4 = (long *)((long)&pcVar17->bstats[0].nslabs + lVar16);
    *plVar4 = *plVar2 + lVar10;
    plVar4[1] = lVar8 + lVar11;
    if (!destroyed) {
      plVar2 = (long *)((long)&pcVar7->bstats[0].curslabs + lVar16);
      lVar8 = plVar2[1];
      plVar4 = (long *)((long)&pcVar17->bstats[0].curslabs + lVar16);
      lVar9 = plVar4[1];
      plVar5 = (long *)((long)&pcVar17->bstats[0].curslabs + lVar16);
      *plVar5 = *plVar4 + *plVar2;
      plVar5[1] = lVar9 + lVar8;
    }
    nstime_add((nstime_t *)((long)&pcVar17->bstats[0].mutex_data.tot_wait_time.ns + lVar16),
               (nstime_t *)((long)&pcVar7->bstats[0].mutex_data.tot_wait_time.ns + lVar16));
    pnVar19 = (nstime_t *)((long)&pcVar17->bstats[0].mutex_data.max_wait_time.ns + lVar16);
    pnVar20 = (nstime_t *)((long)&pcVar7->bstats[0].mutex_data.max_wait_time.ns + lVar16);
    iVar12 = nstime_compare(pnVar19,pnVar20);
    if (iVar12 < 0) {
      nstime_copy(pnVar19,pnVar20);
    }
    plVar2 = (long *)((long)&pcVar7->bstats[0].mutex_data.n_wait_times + lVar16);
    lVar8 = plVar2[1];
    plVar4 = (long *)((long)&pcVar17->bstats[0].mutex_data.n_wait_times + lVar16);
    lVar9 = plVar4[1];
    plVar5 = (long *)((long)&pcVar17->bstats[0].mutex_data.n_wait_times + lVar16);
    *plVar5 = *plVar4 + *plVar2;
    plVar5[1] = lVar9 + lVar8;
    uVar6 = *(uint *)((long)&pcVar7->bstats[0].mutex_data.max_n_thds + lVar16);
    if (*(uint *)((long)&pcVar17->bstats[0].mutex_data.max_n_thds + lVar16) < uVar6) {
      *(uint *)((long)&pcVar17->bstats[0].mutex_data.max_n_thds + lVar16) = uVar6;
    }
    *(int *)((long)&pcVar17->bstats[0].mutex_data.n_waiting_thds.repr + lVar16) =
         *(int *)((long)&pcVar7->bstats[0].mutex_data.n_waiting_thds.repr + lVar16) +
         *(int *)((long)&pcVar17->bstats[0].mutex_data.n_waiting_thds.repr + lVar16);
    plVar2 = (long *)((long)&pcVar17->bstats[0].mutex_data.n_owner_switches + lVar16);
    *plVar2 = *plVar2 + *(long *)((long)&pcVar7->bstats[0].mutex_data.n_owner_switches + lVar16);
    plVar2 = (long *)((long)&pcVar17->bstats[0].mutex_data.n_lock_ops + lVar16);
    *plVar2 = *plVar2 + *(long *)((long)&pcVar7->bstats[0].mutex_data.n_lock_ops + lVar16);
    lVar16 = lVar16 + 0x90;
  } while (lVar16 != 0x1440);
  lVar16 = 0;
  do {
    *(long *)((long)&pcVar17->lstats[0].nmalloc.repr + lVar16) =
         *(long *)((long)&pcVar7->lstats[0].nmalloc.repr + lVar16) +
         *(long *)((long)&pcVar17->lstats[0].nmalloc.repr + lVar16);
    *(long *)((long)&pcVar17->lstats[0].ndalloc.repr + lVar16) =
         *(long *)((long)&pcVar7->lstats[0].ndalloc.repr + lVar16) +
         *(long *)((long)&pcVar17->lstats[0].ndalloc.repr + lVar16);
    *(long *)((long)&pcVar17->lstats[0].nrequests.repr + lVar16) =
         *(long *)((long)&pcVar7->lstats[0].nrequests.repr + lVar16) +
         *(long *)((long)&pcVar17->lstats[0].nrequests.repr + lVar16);
    if (!destroyed) {
      plVar2 = (long *)((long)&pcVar17->lstats[0].curlextents + lVar16);
      *plVar2 = *plVar2 + *(long *)((long)&pcVar7->lstats[0].curlextents + lVar16);
    }
    lVar16 = lVar16 + 0x30;
  } while (lVar16 != 0x24c0);
  lVar16 = 0;
  do {
    *(long *)((long)&pcVar17->estats[0].ndirty.repr + lVar16) =
         *(long *)((long)&pcVar7->estats[0].ndirty.repr + lVar16) +
         *(long *)((long)&pcVar17->estats[0].ndirty.repr + lVar16);
    *(long *)((long)&pcVar17->estats[0].nmuzzy.repr + lVar16) =
         *(long *)((long)&pcVar7->estats[0].nmuzzy.repr + lVar16) +
         *(long *)((long)&pcVar17->estats[0].nmuzzy.repr + lVar16);
    *(long *)((long)&pcVar17->estats[0].nretained.repr + lVar16) =
         *(long *)((long)&pcVar7->estats[0].nretained.repr + lVar16) +
         *(long *)((long)&pcVar17->estats[0].nretained.repr + lVar16);
    *(long *)((long)&pcVar17->estats[0].dirty_bytes.repr + lVar16) =
         *(long *)((long)&pcVar7->estats[0].dirty_bytes.repr + lVar16) +
         *(long *)((long)&pcVar17->estats[0].dirty_bytes.repr + lVar16);
    *(long *)((long)&pcVar17->estats[0].muzzy_bytes.repr + lVar16) =
         *(long *)((long)&pcVar7->estats[0].muzzy_bytes.repr + lVar16) +
         *(long *)((long)&pcVar17->estats[0].muzzy_bytes.repr + lVar16);
    *(long *)((long)&pcVar17->estats[0].retained_bytes.repr + lVar16) =
         *(long *)((long)&pcVar7->estats[0].retained_bytes.repr + lVar16) +
         *(long *)((long)&pcVar17->estats[0].retained_bytes.repr + lVar16);
    lVar16 = lVar16 + 0x30;
  } while (lVar16 != 0x2550);
  return;
}

Assistant:

static void
ctl_arena_refresh(tsdn_t *tsdn, arena_t *arena, ctl_arena_t *ctl_sdarena,
    unsigned i, bool destroyed) {
	ctl_arena_t *ctl_arena = arenas_i(i);

	ctl_arena_clear(ctl_arena);
	ctl_arena_stats_amerge(tsdn, ctl_arena, arena);
	/* Merge into sum stats as well. */
	ctl_arena_stats_sdmerge(ctl_sdarena, ctl_arena, destroyed);
}